

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O2

djg_mesh * djgm_load_cone(int slices,int stacks)

{
  djgm_vertex *pdVar1;
  int iVar2;
  djg_mesh *pdVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  pdVar3 = djgm_load_plane(slices,stacks);
  uVar5 = stacks + 2;
  uVar9 = 0;
  uVar4 = 0;
  if (0 < (int)uVar5) {
    uVar4 = (ulong)uVar5;
  }
  iVar2 = -2;
  if (-2 < slices) {
    iVar2 = slices;
  }
  lVar8 = 0x38;
  for (; lVar6 = lVar8, uVar7 = uVar4, uVar9 != iVar2 + 2; uVar9 = uVar9 + 1) {
    while (uVar7 != 0) {
      pdVar1 = pdVar3->vertexv;
      fVar12 = *(float *)((long)pdVar1 + lVar6 + -0x28);
      fVar11 = *(float *)((long)pdVar1 + lVar6 + -0x24);
      fVar12 = (fVar12 + fVar12) * 3.1415927;
      fVar10 = cosf(fVar12);
      *(float *)((long)pdVar1 + lVar6 + -0x38) = fVar10 * *(float *)((long)pdVar1 + lVar6 + -0x24);
      fVar10 = sinf(fVar12);
      *(float *)((long)pdVar1 + lVar6 + -0x34) = fVar10 * *(float *)((long)pdVar1 + lVar6 + -0x24);
      *(float *)((long)pdVar1 + lVar6 + -0x30) = fVar11 + fVar11 + -1.0;
      fVar11 = sinf(fVar12);
      *(float *)((long)pdVar1 + lVar6 + -0x18) = -fVar11;
      fVar11 = cosf(fVar12);
      *(float *)((long)pdVar1 + lVar6 + -0x14) = fVar11;
      *(undefined4 *)((long)pdVar1 + lVar6 + -0x10) = 0;
      fVar11 = cosf(fVar12);
      *(float *)((long)pdVar1 + lVar6 + -8) = fVar11 * 0.70710677;
      fVar12 = sinf(fVar12);
      *(float *)((long)pdVar1 + lVar6 + -4) = fVar12 * 0.70710677;
      *(undefined4 *)((long)&(pdVar1->p).x + lVar6) = 0x3f3504f3;
      lVar6 = lVar6 + 0x40;
      uVar7 = uVar7 - 1;
    }
    lVar8 = lVar8 + (long)(int)uVar5 * 0x40;
  }
  return pdVar3;
}

Assistant:

DJGDEF djg_mesh *
djgm_load_cone(int slices, int stacks)
{
    djg_mesh *mesh = djgm_load_plane(slices, stacks);;
    int i, j;

    slices+= 2;
    stacks+= 2;

    for (i = 0; i < slices; ++i)
    for (j = 0; j < stacks; ++j) {
        djgm_vertex *v = &mesh->vertexv[i * stacks + j];
        float phi = v->st.s * 2 * M_PI;
        float z = 2 * v->st.t - 1;
        float nrm = sqrt(2.f) / 2.f;

        v->p.x = cos(phi)* v->st.t;
        v->p.y = sin(phi)* v->st.t;
        v->p.z = z;

        v->dpds.x = -sin(phi);
        v->dpds.y = +cos(phi);
        v->dpds.z = 0;

        v->dpdt.x = cos(phi) * nrm;
        v->dpdt.y = sin(phi) * nrm;
        v->dpdt.z = nrm;
    }

    return mesh;
}